

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::JavaGenerator::Generate
          (JavaGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  FileGenerator *pFVar6;
  reference ppFVar7;
  string *psVar8;
  undefined4 extraout_var;
  pointer pZVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar10;
  undefined4 extraout_var_02;
  AnnotationCollector **local_498;
  int local_41c;
  undefined1 local_418 [4];
  int i_5;
  Printer annotation_list_printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  annotation_list_raw_output;
  undefined1 local_368 [4];
  int i_4;
  Printer srclist_printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  srclist_raw_output;
  int i_3;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  info_output;
  Printer printer;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string info_full_path;
  string java_filename;
  undefined1 local_168 [8];
  string package_dir;
  FileGenerator *file_generator;
  int local_138;
  int i_2;
  int j;
  int i_1;
  FileGenerator *local_128;
  undefined1 local_120 [8];
  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
  file_generators;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  Options file_options;
  undefined1 local_50 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  JavaGenerator *this_local;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
  ParseGeneratorParameter
            (parameter,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  Options::Options((Options *)local_a8);
  for (local_ac = 0; uVar3 = (ulong)local_ac,
      sVar4 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_50), uVar3 < sVar4; local_ac = local_ac + 1) {
    pvVar5 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,(long)local_ac);
    bVar1 = std::operator==(&pvVar5->first,"output_list_file");
    if (bVar1) {
      pvVar5 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)local_ac);
      std::__cxx11::string::operator=
                ((string *)(file_options.annotation_list_file.field_2._M_local_buf + 8),
                 (string *)&pvVar5->second);
    }
    else {
      pvVar5 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)local_ac);
      bVar1 = std::operator==(&pvVar5->first,"immutable");
      if (bVar1) {
        local_a8[0] = true;
      }
      else {
        pvVar5 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_50,(long)local_ac);
        bVar1 = std::operator==(&pvVar5->first,"mutable");
        if (bVar1) {
          local_a8[1] = true;
        }
        else {
          pvVar5 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_50,(long)local_ac);
          bVar1 = std::operator==(&pvVar5->first,"shared");
          if (bVar1) {
            local_a8[2] = true;
          }
          else {
            pvVar5 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_50,(long)local_ac);
            bVar1 = std::operator==(&pvVar5->first,"lite");
            if (bVar1) {
              local_a8[3] = true;
            }
            else {
              pvVar5 = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_50,(long)local_ac);
              bVar1 = std::operator==(&pvVar5->first,"annotate_code");
              if (bVar1) {
                i._0_1_ = 1;
              }
              else {
                pvVar5 = std::
                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_50,(long)local_ac);
                bVar1 = std::operator==(&pvVar5->first,"annotation_list_file");
                if (!bVar1) {
                  pvVar5 = std::
                           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_50,(long)local_ac);
                  std::operator+(&local_d0,"Unknown generator option: ",&pvVar5->first);
                  std::__cxx11::string::operator=
                            ((string *)
                             options.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_d0)
                  ;
                  std::__cxx11::string::~string((string *)&local_d0);
                  this_local._7_1_ = false;
                  goto LAB_004794c5;
                }
                pvVar5 = std::
                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_50,(long)local_ac);
                std::__cxx11::string::operator=((string *)&file_options,(string *)&pvVar5->second);
              }
            }
          }
        }
      }
    }
  }
  if (((local_a8[3] & 1U) == 0) || ((local_a8[1] & 1U) == 0)) {
    if (((local_a8[0] & 1U) == 0) && (((local_a8[1] & 1U) == 0 && ((local_a8[2] & 1U) == 0)))) {
      local_a8[0] = true;
      local_a8[2] = true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&all_annotations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&file_generators.
                 super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
    ::vector((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
              *)local_120);
    if ((local_a8[0] & 1U) != 0) {
      pFVar6 = (FileGenerator *)operator_new(0xe0);
      FileGenerator::FileGenerator(pFVar6,file,(Options *)local_a8,true);
      local_128 = pFVar6;
      std::
      vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
      ::push_back((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                   *)local_120,&local_128);
    }
    if ((local_a8[1] & 1U) != 0) {
      pFVar6 = (FileGenerator *)operator_new(0xe0);
      FileGenerator::FileGenerator(pFVar6,file,(Options *)local_a8,false);
      _j = pFVar6;
      std::
      vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
      ::push_back((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                   *)local_120,(value_type *)&j);
    }
    i_2 = 0;
LAB_00478c55:
    sVar4 = std::
            vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
            ::size((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                    *)local_120);
    if ((ulong)(long)i_2 < sVar4) {
      ppFVar7 = std::
                vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                ::operator[]((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                              *)local_120,(long)i_2);
      bVar1 = FileGenerator::Validate
                        (*ppFVar7,&(options.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
      if (bVar1) goto LAB_00478d4f;
      for (local_138 = 0;
          sVar4 = std::
                  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ::size((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                          *)local_120), (ulong)(long)local_138 < sVar4; local_138 = local_138 + 1) {
        ppFVar7 = std::
                  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ::operator[]((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                                *)local_120,(long)local_138);
        pFVar6 = *ppFVar7;
        if (pFVar6 != (FileGenerator *)0x0) {
          FileGenerator::~FileGenerator(pFVar6);
          operator_delete(pFVar6);
        }
      }
      this_local._7_1_ = false;
    }
    else {
      for (file_generator._4_4_ = 0;
          sVar4 = std::
                  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ::size((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                          *)local_120), (ulong)(long)file_generator._4_4_ < sVar4;
          file_generator._4_4_ = file_generator._4_4_ + 1) {
        ppFVar7 = std::
                  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ::operator[]((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                                *)local_120,(long)file_generator._4_4_);
        package_dir.field_2._8_8_ = *ppFVar7;
        psVar8 = FileGenerator::java_package_abi_cxx11_((FileGenerator *)package_dir.field_2._8_8_);
        std::__cxx11::string::string
                  ((string *)(java_filename.field_2._M_local_buf + 8),(string *)psVar8);
        JavaPackageToDir((string *)local_168,(string *)((long)&java_filename.field_2 + 8));
        std::__cxx11::string::~string((string *)(java_filename.field_2._M_local_buf + 8));
        std::__cxx11::string::string
                  ((string *)(info_full_path.field_2._M_local_buf + 8),(string *)local_168);
        psVar8 = FileGenerator::classname_abi_cxx11_((FileGenerator *)package_dir.field_2._8_8_);
        std::__cxx11::string::operator+=
                  ((string *)(info_full_path.field_2._M_local_buf + 8),(string *)psVar8);
        std::__cxx11::string::operator+=
                  ((string *)(info_full_path.field_2._M_local_buf + 8),".java");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&all_annotations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (value_type *)((long)&info_full_path.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&info_full_path.field_2 + 8),".pb.meta");
        if (((byte)i & 1) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&file_generators.
                          super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&output);
        }
        iVar2 = (*context->_vptr_GeneratorContext[2])
                          (context,(undefined1 *)((long)&info_full_path.field_2 + 8));
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
        ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                  ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                    *)&annotations._cached_size_,(pointer)CONCAT44(extraout_var,iVar2));
        GeneratedCodeInfo::GeneratedCodeInfo
                  ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
        io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
                  ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                   &printer.annotation_collector_,
                   (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
        pZVar9 = std::
                 unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                        *)&annotations._cached_size_);
        if (((byte)i & 1) == 0) {
          local_498 = (AnnotationCollector **)0x0;
        }
        else {
          local_498 = &printer.annotation_collector_;
        }
        io::Printer::Printer((Printer *)&info_output,pZVar9,'$',(AnnotationCollector *)local_498);
        FileGenerator::Generate((FileGenerator *)package_dir.field_2._8_8_,(Printer *)&info_output);
        FileGenerator::GenerateSiblings
                  ((FileGenerator *)package_dir.field_2._8_8_,(string *)local_168,context,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&all_annotations.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&file_generators.
                       super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((byte)i & 1) != 0) {
          iVar2 = (*context->_vptr_GeneratorContext[2])(context,&output);
          std::
          unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
          ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                    ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                      *)&stack0xfffffffffffffd48,(pointer)CONCAT44(extraout_var_00,iVar2));
          pZVar9 = std::
                   unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                          *)&stack0xfffffffffffffd48);
          MessageLite::SerializeToZeroCopyStream
                    ((MessageLite *)&annotation_collector.annotation_proto_,pZVar9);
          std::
          unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         *)&stack0xfffffffffffffd48);
        }
        io::Printer::~Printer((Printer *)&info_output);
        io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
                  ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                   &printer.annotation_collector_);
        GeneratedCodeInfo::~GeneratedCodeInfo
                  ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       *)&annotations._cached_size_);
        std::__cxx11::string::~string((string *)&output);
        std::__cxx11::string::~string((string *)(info_full_path.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_168);
      }
      for (srclist_raw_output._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl.
           _4_4_ = 0;
          sVar4 = std::
                  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ::size((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                          *)local_120),
          (ulong)(long)srclist_raw_output._M_t.
                       super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                       _M_head_impl._4_4_ < sVar4;
          srclist_raw_output._M_t.
          super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl.
          _4_4_ = srclist_raw_output._M_t.
                  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                  _M_head_impl._4_4_ + 1) {
        ppFVar7 = std::
                  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ::operator[]((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                                *)local_120,
                               (long)srclist_raw_output._M_t.
                                     super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                     .
                                     super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                                     ._M_head_impl._4_4_);
        pFVar6 = *ppFVar7;
        if (pFVar6 != (FileGenerator *)0x0) {
          FileGenerator::~FileGenerator(pFVar6);
          operator_delete(pFVar6);
        }
      }
      std::
      vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
      ::clear((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
               *)local_120);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        iVar2 = (*context->_vptr_GeneratorContext[2])
                          (context,(undefined1 *)
                                   ((long)&file_options.annotation_list_file.field_2 + 8));
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
        ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                  ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                    *)&srclist_printer.annotation_collector_,
                   (pointer)CONCAT44(extraout_var_01,iVar2));
        pZVar9 = std::
                 unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                        *)&srclist_printer.annotation_collector_);
        io::Printer::Printer((Printer *)local_368,pZVar9,'$');
        for (annotation_list_raw_output._M_t.
             super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
             _M_head_impl._4_4_ = 0;
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&all_annotations.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
            (ulong)(long)annotation_list_raw_output._M_t.
                         super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                         ._M_head_impl._4_4_ < sVar4;
            annotation_list_raw_output._M_t.
            super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl
            ._4_4_ = annotation_list_raw_output._M_t.
                     super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                     _M_head_impl._4_4_ + 1) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&all_annotations.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)annotation_list_raw_output._M_t.
                                       super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                       .
                                       super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                                       ._M_head_impl._4_4_);
          io::Printer::Print<char[9],std::__cxx11::string>
                    ((Printer *)local_368,"$filename$\n",(char (*) [9])"filename",pvVar10);
        }
        io::Printer::~Printer((Printer *)local_368);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       *)&srclist_printer.annotation_collector_);
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        iVar2 = (*context->_vptr_GeneratorContext[2])(context,&file_options);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
        ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                  ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                    *)&annotation_list_printer.annotation_collector_,
                   (pointer)CONCAT44(extraout_var_02,iVar2));
        pZVar9 = std::
                 unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                        *)&annotation_list_printer.annotation_collector_);
        io::Printer::Printer((Printer *)local_418,pZVar9,'$');
        for (local_41c = 0;
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&file_generators.
                               super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
            (ulong)(long)local_41c < sVar4; local_41c = local_41c + 1) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&file_generators.
                                     super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)local_41c);
          io::Printer::Print<char[9],std::__cxx11::string>
                    ((Printer *)local_418,"$filename$\n",(char (*) [9])"filename",pvVar10);
        }
        io::Printer::~Printer((Printer *)local_418);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       *)&annotation_list_printer.annotation_collector_);
      }
      this_local._7_1_ = true;
    }
    std::
    vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
    ::~vector((vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
               *)local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&file_generators.
                  super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&all_annotations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)
               options.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "lite runtime generator option cannot be used with mutable API.");
    this_local._7_1_ = false;
  }
LAB_004794c5:
  Options::~Options((Options *)local_a8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_50);
  return this_local._7_1_;
LAB_00478d4f:
  i_2 = i_2 + 1;
  goto LAB_00478c55;
}

Assistant:

bool JavaGenerator::Generate(const FileDescriptor* file,
                             const std::string& parameter,
                             GeneratorContext* context,
                             std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "output_list_file") {
      file_options.output_list_file = options[i].second;
    } else if (options[i].first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (options[i].first == "mutable") {
      file_options.generate_mutable_code = true;
    } else if (options[i].first == "shared") {
      file_options.generate_shared_code = true;
    } else if (options[i].first == "lite") {
      // Note: Java Lite does not guarantee API/ABI stability. We may choose to
      // break existing API in order to boost performance / reduce code size.
      file_options.enforce_lite = true;
    } else if (options[i].first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (options[i].first == "annotation_list_file") {
      file_options.annotation_list_file = options[i].second;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  if (file_options.enforce_lite && file_options.generate_mutable_code) {
    *error = "lite runtime generator option cannot be used with mutable API.";
    return false;
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_mutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  // -----------------------------------------------------------------


  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;


  std::vector<FileGenerator*> file_generators;
  if (file_options.generate_immutable_code) {
    file_generators.push_back(new FileGenerator(file, file_options,
                                                /* immutable = */ true));
  }
  if (file_options.generate_mutable_code) {
    file_generators.push_back(new FileGenerator(file, file_options,
                                                /* mutable = */ false));
  }

  for (int i = 0; i < file_generators.size(); ++i) {
    if (!file_generators[i]->Validate(error)) {
      for (int j = 0; j < file_generators.size(); ++j) {
        delete file_generators[j];
      }
      return false;
    }
  }

  for (int i = 0; i < file_generators.size(); ++i) {
    FileGenerator* file_generator = file_generators[i];

    std::string package_dir = JavaPackageToDir(file_generator->java_package());

    std::string java_filename = package_dir;
    java_filename += file_generator->classname();
    java_filename += ".java";
    all_files.push_back(java_filename);
    std::string info_full_path = java_filename + ".pb.meta";
    if (file_options.annotate_code) {
      all_annotations.push_back(info_full_path);
    }

    // Generate main java file.
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(java_filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_code ? &annotation_collector : NULL);

    file_generator->Generate(&printer);

    // Generate sibling files.
    file_generator->GenerateSiblings(package_dir, context, &all_files,
                                     &all_annotations);

    if (file_options.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }


  for (int i = 0; i < file_generators.size(); ++i) {
    delete file_generators[i];
  }
  file_generators.clear();

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
        context->Open(file_options.output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> annotation_list_raw_output(
        context->Open(file_options.annotation_list_file));
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (int i = 0; i < all_annotations.size(); i++) {
      annotation_list_printer.Print("$filename$\n", "filename",
                                    all_annotations[i]);
    }
  }

  return true;
}